

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

void lws_close_reason(lws *wsi,lws_close_status status,uchar *buf,size_t len)

{
  _lws_websocket_related *p_Var1;
  int budget;
  uchar *start;
  uchar *p;
  size_t len_local;
  uchar *buf_local;
  lws_close_status status_local;
  lws *wsi_local;
  
  if (wsi->role_ops == &role_ops_ws) {
    p_Var1 = wsi->ws;
    p_Var1->ping_payload_buf[0x10] = (uint8_t)(status >> 8);
    start = p_Var1->ping_payload_buf + 0x12;
    p_Var1->ping_payload_buf[0x11] = (uint8_t)status;
    p = (uchar *)len;
    len_local = (size_t)buf;
    if (buf != (uchar *)0x0) {
      while (p != (uchar *)0x0 && start < &p_Var1->field_0x95) {
        *start = *(uchar *)len_local;
        start = start + 1;
        p = p + -1;
        len_local = len_local + 1;
      }
    }
    wsi->ws->close_in_ping_buffer_len = (char)start - (char)(p_Var1->ping_payload_buf + 0x10);
    return;
  }
  __assert_fail("lwsi_role_ws(wsi)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/ws/ops-ws.c"
                ,0x394,
                "void lws_close_reason(struct lws *, enum lws_close_status, unsigned char *, size_t)"
               );
}

Assistant:

void
lws_close_reason(struct lws *wsi, enum lws_close_status status,
		 unsigned char *buf, size_t len)
{
	unsigned char *p, *start;
	int budget = sizeof(wsi->ws->ping_payload_buf) - LWS_PRE;

	assert(lwsi_role_ws(wsi));

	start = p = &wsi->ws->ping_payload_buf[LWS_PRE];

	*p++ = (((int)status) >> 8) & 0xff;
	*p++ = ((int)status) & 0xff;

	if (buf)
		while (len-- && p < start + budget)
			*p++ = *buf++;

	wsi->ws->close_in_ping_buffer_len = lws_ptr_diff(p, start);
}